

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O3

wchar_t do_unstore_file(archive_read *a,rar5 *rar,void **buf,size_t *size,int64_t *offset)

{
  long lVar1;
  wchar_t wVar2;
  uint8_t *p;
  size_t sVar3;
  size_t min;
  ssize_t avail;
  ssize_t local_38;
  
  sVar3 = (rar->file).bytes_remaining;
  if (sVar3 == 0) {
    if (((ulong)rar->main & 2) == 0) {
      return L'\x01';
    }
    if ((undefined1  [12])((undefined1  [12])rar->generic & (undefined1  [12])0x1) ==
        (undefined1  [12])0x0) {
      return L'\x01';
    }
    *(byte *)&rar->cstate = *(byte *)&rar->cstate | 4;
    wVar2 = advance_multivolume(a);
    *(byte *)&rar->cstate = *(byte *)&rar->cstate & 0xfb;
    if (wVar2 != L'\0') {
      return wVar2;
    }
    sVar3 = (rar->file).bytes_remaining;
    min = 0x10000;
    if ((long)sVar3 < 0x10000) {
      min = sVar3;
    }
    if (sVar3 == 0) {
      return L'\x01';
    }
  }
  else {
    min = 0x10000;
    if ((long)sVar3 < 0x10000) {
      min = sVar3;
    }
  }
  local_38 = -1;
  p = (uint8_t *)__archive_read_ahead(a,min,&local_38);
  if (p == (uint8_t *)0x0) {
    archive_set_error(&a->archive,0x54,"I/O error when unstoring file");
    wVar2 = L'\xffffffe2';
  }
  else {
    sVar3 = __archive_read_consume(a,min);
    wVar2 = L'\x01';
    if (sVar3 == min) {
      if (buf != (void **)0x0) {
        *buf = p;
      }
      if (size != (size_t *)0x0) {
        *size = min;
      }
      lVar1 = (rar->cstate).last_unstore_ptr;
      if (offset != (int64_t *)0x0) {
        *offset = lVar1;
      }
      (rar->file).bytes_remaining = (rar->file).bytes_remaining - min;
      (rar->cstate).last_unstore_ptr = lVar1 + min;
      update_crc(rar,p,min);
      wVar2 = L'\0';
    }
  }
  return wVar2;
}

Assistant:

static int do_unstore_file(struct archive_read* a,
    struct rar5* rar, const void** buf, size_t* size, int64_t* offset)
{
	size_t to_read;
	const uint8_t* p;

	if(rar->file.bytes_remaining == 0 && rar->main.volume > 0 &&
	    rar->generic.split_after > 0)
	{
		int ret;

		rar->cstate.switch_multivolume = 1;
		ret = advance_multivolume(a);
		rar->cstate.switch_multivolume = 0;

		if(ret != ARCHIVE_OK) {
			/* Failed to advance to next multivolume archive
			 * file. */
			return ret;
		}
	}

	to_read = rar5_min(rar->file.bytes_remaining, 64 * 1024);
	if(to_read == 0) {
		return ARCHIVE_EOF;
	}

	if(!read_ahead(a, to_read, &p)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "I/O error when unstoring file");
		return ARCHIVE_FATAL;
	}

	if(ARCHIVE_OK != consume(a, to_read)) {
		return ARCHIVE_EOF;
	}

	if(buf)    *buf = p;
	if(size)   *size = to_read;
	if(offset) *offset = rar->cstate.last_unstore_ptr;

	rar->file.bytes_remaining -= to_read;
	rar->cstate.last_unstore_ptr += to_read;

	update_crc(rar, p, to_read);
	return ARCHIVE_OK;
}